

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_from_text_l
                  (archive_acl *acl,char *text,wchar_t want_type,archive_string_conv *sc)

{
  char cVar1;
  byte *pbVar2;
  anon_struct_16_2_267fbce2 *paVar3;
  int iVar4;
  int iVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  char *p;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  archive_acl_entry *paVar11;
  wchar_t wVar12;
  anon_struct_16_2_267fbce2 *paVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  wchar_t wVar18;
  ulong uVar19;
  uint uVar20;
  byte *pbVar21;
  int *piVar22;
  ulong uVar23;
  byte *pbVar24;
  ulong uVar25;
  wchar_t local_e4;
  wchar_t local_e0;
  wchar_t id;
  wchar_t local_d8;
  wchar_t local_d4;
  char *local_d0;
  wchar_t local_c4;
  char *local_c0;
  ulong local_b8;
  wchar_t local_ac;
  archive_acl *local_a8;
  archive_string_conv *local_a0;
  anon_struct_16_2_267fbce2 field [6];
  
  uVar25 = 5;
  local_c4 = want_type;
  if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
    if (want_type == L'㰀') {
      uVar25 = 6;
    }
    else {
      if (want_type != L'̀') {
        return L'\xffffffe2';
      }
      local_c4 = L'Ā';
    }
  }
  local_ac = L'\0';
  wVar7 = L'\0';
  local_a8 = acl;
  local_a0 = sc;
switchD_0048c218_caseD_7:
  do {
    do {
      local_e0 = wVar7;
      if (((byte *)text == (byte *)0x0) || (*text == 0)) {
        archive_acl_reset(local_a8,local_ac);
        return local_e0;
      }
      uVar19 = 0;
      uVar14 = 1;
      paVar3 = field + 1;
      do {
        while ((paVar13 = paVar3, uVar8 = uVar14, uVar23 = uVar19, uVar19 = (ulong)(byte)*text,
               pbVar21 = (byte *)text, uVar19 < 0x21 && ((0x100000600U >> (uVar19 & 0x3f) & 1) != 0)
               )) {
          text = (char *)((byte *)text + 1);
          uVar19 = uVar23;
          uVar14 = uVar8;
          paVar3 = paVar13;
        }
        while ((bVar15 = (byte)uVar19, 0x3a < bVar15 ||
               (pbVar2 = pbVar21, (0x400100000000401U >> (uVar19 & 0x3f) & 1) == 0))) {
          uVar19 = (ulong)pbVar21[1];
          pbVar21 = pbVar21 + 1;
        }
        do {
          pbVar24 = pbVar2;
          if (0x20 < (ulong)pbVar24[-1]) break;
          pbVar2 = pbVar24 + -1;
        } while ((0x100000600U >> ((ulong)pbVar24[-1] & 0x3f) & 1) != 0);
        if (uVar23 < uVar25) {
          field[uVar23].start = text;
          field[uVar23].end = (char *)pbVar24;
        }
        pcVar10 = field[0].start;
        text = (char *)(pbVar21 + (bVar15 != 0));
        uVar19 = uVar23 + 1;
        uVar14 = uVar8 + 1;
        paVar3 = paVar13 + 1;
      } while (bVar15 == 0x3a);
      text = (char *)(pbVar21 + (bVar15 != 0));
      for (; uVar8 < uVar25; uVar8 = uVar8 + 1) {
        paVar13->start = (char *)0x0;
        paVar13->end = (char *)0x0;
        paVar13 = paVar13 + 1;
      }
    } while ((field[0].start != (char *)0x0) && (wVar7 = local_e0, *field[0].start == '#'));
    id = L'\xffffffff';
    local_d8 = L'\0';
    uVar19 = (long)field[0].end - (long)field[0].start;
    if (local_c4 == L'㰀') goto code_r0x0048c1f6;
    uVar14 = 0;
    if (*field[0].start == 'd') {
      local_e4 = L'Ȁ';
      if (uVar19 == 1) {
LAB_0048c248:
        uVar14 = 1;
      }
      else {
        if (uVar19 < 7) goto LAB_0048c280;
        local_d0 = field[0].start;
        iVar4 = bcmp(field[0].start + 1,"efault",6);
        if (iVar4 == 0) {
          uVar14 = 0;
          if (uVar19 == 7) goto LAB_0048c248;
          field[0].start = local_d0 + 7;
        }
        else {
          local_e4 = local_c4;
          uVar14 = 0;
        }
      }
    }
    else {
LAB_0048c280:
      local_e4 = local_c4;
    }
    uVar17 = (int)uVar14 + 1;
    uVar19 = (ulong)(uVar17 * 0x10);
    local_d0 = *(char **)((long)&field[0].start + uVar19);
    local_c0 = *(char **)((long)&field[0].end + uVar19);
    local_b8 = uVar14;
    isint(local_d0,local_c0,&id);
    iVar4 = (int)local_b8;
    uVar20 = (uint)uVar23;
    if ((id == L'\xffffffff') && (iVar4 + 3U <= uVar20)) {
      uVar19 = (ulong)((iVar4 + 3U) * 0x10);
      isint(*(char **)((long)&field[0].start + uVar19),*(char **)((long)&field[0].end + uVar19),&id)
      ;
      iVar4 = (int)local_b8;
    }
    pcVar10 = *(char **)((long)&field[0].start + (ulong)(uint)(iVar4 << 4));
    uVar16 = (int)*pcVar10 - 0x67U >> 1 | (uint)(((int)*pcVar10 - 0x67U & 1) != 0) << 0x1f;
    wVar7 = L'\xffffffec';
  } while (7 < uVar16);
  lVar9 = *(long *)((long)&field[0].end + (ulong)(uint)(iVar4 << 4)) - (long)pcVar10;
  piVar22 = (int *)(pcVar10 + 1);
  switch(uVar16) {
  case 0:
    wVar18 = L'✔';
    wVar12 = L'✓';
    if ((lVar9 != 1) && ((lVar9 != 5 || (*piVar22 != 0x70756f72)))) goto switchD_0048c218_caseD_7;
    break;
  default:
    goto switchD_0048c218_caseD_7;
  case 3:
    wVar12 = L'✕';
    if (lVar9 == 1) goto LAB_0048c535;
    if (lVar9 != 4) goto switchD_0048c218_caseD_7;
    iVar5 = bcmp(piVar22,"ask",3);
    iVar4 = (int)local_b8;
    wVar12 = L'✕';
    wVar7 = L'\xffffffec';
    if (iVar5 != 0) goto switchD_0048c218_caseD_7;
    goto LAB_0048c535;
  case 4:
    wVar12 = L'✖';
    if ((lVar9 != 1) && ((lVar9 != 5 || (*piVar22 != 0x72656874)))) goto switchD_0048c218_caseD_7;
LAB_0048c535:
    pcVar10 = local_c0;
    if (local_c0 <= local_d0 || uVar17 != uVar20) {
LAB_0048c58f:
      wVar7 = L'\xffffffec';
      if (iVar4 + 2U != uVar20 || pcVar10 <= local_d0) {
        local_c0 = (char *)0x0;
        local_d0 = (char *)0x0;
        iVar5 = 0;
        goto LAB_0048c5b6;
      }
      goto switchD_0048c218_caseD_7;
    }
    local_d4 = wVar12;
    wVar7 = ismode(local_d0,local_c0,&local_d8);
    iVar4 = (int)local_b8;
    wVar12 = local_d4;
    if (wVar7 == L'\0') goto LAB_0048c58f;
    local_c0 = (char *)0x0;
    local_d0 = (char *)0x0;
    iVar5 = -1;
    goto LAB_0048c5b6;
  case 7:
    wVar18 = L'✒';
    wVar12 = L'✑';
    if (lVar9 != 1) {
      if (lVar9 != 4) goto switchD_0048c218_caseD_7;
      iVar5 = bcmp(piVar22,"ser",3);
      iVar4 = (int)local_b8;
      wVar12 = L'✑';
      wVar7 = L'\xffffffec';
      if (iVar5 != 0) goto switchD_0048c218_caseD_7;
    }
  }
  iVar5 = 0;
  if ((local_c0 <= local_d0) && (id == L'\xffffffff')) {
    local_c0 = (char *)0x0;
    local_d0 = (char *)0x0;
    wVar12 = wVar18;
  }
LAB_0048c5b6:
  wVar18 = local_d8;
  if (local_d8 != L'\0') goto LAB_0048c878;
  uVar17 = iVar5 + iVar4 + 2;
  wVar6 = ismode(field[uVar17].start,field[uVar17].end,&local_d8);
  wVar7 = L'\xffffffec';
  wVar18 = local_d8;
  if (wVar6 == L'\0') goto switchD_0048c218_caseD_7;
LAB_0048c878:
  local_b8 = CONCAT44(local_b8._4_4_,id);
  local_d4 = wVar12;
  wVar7 = acl_special(local_a8,local_e4,wVar18,wVar12);
  if (wVar7 != L'\0') {
    paVar11 = acl_new_entry(local_a8,local_e4,wVar18,local_d4,(wchar_t)local_b8);
    if (paVar11 == (archive_acl_entry *)0x0) {
      return L'\xffffffe7';
    }
    if (((local_d0 == (char *)0x0) || (local_c0 == local_d0)) || (*local_d0 == '\0')) {
      archive_mstring_clean(&paVar11->name);
    }
    else {
      wVar7 = archive_mstring_copy_mbs_len_l
                        (&paVar11->name,local_d0,(long)local_c0 - (long)local_d0,local_a0);
      if (wVar7 != L'\0') {
        piVar22 = __errno_location();
        local_e0 = L'\xffffffec';
        if (*piVar22 == 0xc) {
          return L'\xffffffe2';
        }
      }
    }
  }
  local_ac = local_ac | local_e4;
  wVar7 = local_e0;
  goto switchD_0048c218_caseD_7;
code_r0x0048c1f6:
  wVar7 = L'\xffffffec';
  switch(uVar19) {
  case 4:
    if (*(int *)field[0].start != 0x72657375) goto switchD_0048c218_caseD_7;
    wVar12 = L'✑';
    goto LAB_0048c4bc;
  case 5:
    iVar4 = bcmp(field[0].start,"group",5);
    wVar7 = L'\xffffffec';
    if (iVar4 != 0) goto switchD_0048c218_caseD_7;
    wVar12 = L'✓';
LAB_0048c4bc:
    local_d0 = field[1].start;
    local_c0 = field[1].end;
    isint(field[1].start,field[1].end,&id);
    iVar4 = 1;
    break;
  case 6:
    iVar4 = bcmp(field[0].start,"owner@",6);
    if (iVar4 != 0) {
      iVar4 = bcmp(pcVar10,"group@",6);
      wVar7 = L'\xffffffec';
      if (iVar4 != 0) goto switchD_0048c218_caseD_7;
      wVar12 = L'✔';
      goto LAB_0048c412;
    }
    local_c0 = (char *)0x0;
    wVar12 = L'✒';
    local_d0 = (char *)0x0;
    iVar4 = 0;
    break;
  default:
    goto switchD_0048c218_caseD_7;
  case 9:
    iVar4 = bcmp(field[0].start,"everyone@",9);
    wVar7 = L'\xffffffec';
    if (iVar4 != 0) goto switchD_0048c218_caseD_7;
    wVar12 = L'❻';
LAB_0048c412:
    local_c0 = (char *)0x0;
    local_d0 = (char *)0x0;
    iVar4 = 0;
  }
  uVar19 = (ulong)(uint)(iVar4 << 4);
  pcVar10 = *(char **)((long)&field[1].start + uVar19);
  wVar18 = L'\0';
LAB_0048c647:
  wVar7 = L'\xffffffec';
  if (*(char **)((long)&field[1].end + uVar19) <= pcVar10) goto LAB_0048c6ef;
  cVar1 = *pcVar10;
  pcVar10 = pcVar10 + 1;
  uVar17 = 8;
  switch(cVar1) {
  case 'o':
    uVar17 = 0x4000;
    break;
  case 'p':
    uVar17 = 0x20;
    break;
  case 'q':
  case 't':
  case 'u':
  case 'v':
    goto switchD_0048c69f_caseD_71;
  case 'r':
    break;
  case 's':
    uVar17 = 0x8000;
    break;
  case 'w':
    uVar17 = 0x10;
    break;
  case 'x':
    uVar17 = 1;
    break;
  default:
    goto switchD_0048c69f_default;
  }
switchD_0048c69f_caseD_72:
  wVar18 = wVar18 | uVar17;
  goto LAB_0048c647;
LAB_0048c6ef:
  pcVar10 = *(char **)((long)&field[2].start + uVar19);
  while (pcVar10 < *(char **)((long)&field[2].end + uVar19)) {
    cVar1 = *pcVar10;
    pcVar10 = pcVar10 + 1;
    if (cVar1 != '-') {
      if (cVar1 == 'F') {
        uVar17 = 0x40000000;
      }
      else if (cVar1 == 'I') {
        uVar17 = 0x1000000;
      }
      else if (cVar1 == 'S') {
        uVar17 = 0x20000000;
      }
      else if (cVar1 == 'n') {
        uVar17 = 0x8000000;
      }
      else if (cVar1 == 'f') {
        uVar17 = 0x2000000;
      }
      else if (cVar1 == 'i') {
        uVar17 = 0x10000000;
      }
      else {
        if (cVar1 != 'd') goto switchD_0048c69f_caseD_71;
        uVar17 = 0x4000000;
      }
      wVar18 = wVar18 | uVar17;
    }
  }
  piVar22 = *(int **)((long)&field[3].start + uVar19);
  lVar9 = *(long *)((long)&field[3].end + uVar19) - (long)piVar22;
  local_d8 = wVar18;
  local_b8 = uVar19;
  if (lVar9 == 5) {
    local_d4 = wVar12;
    iVar4 = bcmp(piVar22,"allow",5);
    if (iVar4 == 0) {
      local_e4 = L'Ѐ';
    }
    else {
      iVar4 = bcmp(piVar22,"audit",5);
      if (iVar4 == 0) {
        local_e4 = L'က';
      }
      else {
        iVar4 = bcmp(piVar22,"alarm",5);
        wVar7 = L'\xffffffec';
        if (iVar4 != 0) goto switchD_0048c218_caseD_7;
        local_e4 = L'\x2000';
      }
    }
  }
  else {
    if ((lVar9 != 4) || (*piVar22 != 0x796e6564)) goto switchD_0048c218_caseD_7;
    local_e4 = L'ࠀ';
    local_d4 = wVar12;
  }
  isint(*(char **)((long)&field[4].start + local_b8),*(char **)((long)&field[4].end + local_b8),&id)
  ;
  wVar12 = local_d4;
  goto LAB_0048c878;
switchD_0048c69f_default:
  if (cVar1 == '-') goto LAB_0048c647;
  if (cVar1 == 'A') {
    uVar17 = 0x400;
  }
  else if (cVar1 == 'C') {
    uVar17 = 0x2000;
  }
  else if (cVar1 == 'D') {
    uVar17 = 0x100;
  }
  else if (cVar1 == 'R') {
    uVar17 = 0x40;
  }
  else if (cVar1 == 'W') {
    uVar17 = 0x80;
  }
  else if (cVar1 == 'a') {
    uVar17 = 0x200;
  }
  else if (cVar1 == 'c') {
    uVar17 = 0x1000;
  }
  else {
    if (cVar1 != 'd') goto switchD_0048c69f_caseD_71;
    uVar17 = 0x800;
  }
  goto switchD_0048c69f_caseD_72;
switchD_0048c69f_caseD_71:
  local_d8 = wVar18;
  goto switchD_0048c218_caseD_7;
}

Assistant:

int
archive_acl_from_text_l(struct archive_acl *acl, const char *text,
    int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}